

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_complib.c
# Opt level: O0

int load_and_compile_internal(lua_State *L,char *s,char *options)

{
  ravi_State *prVar1;
  C_MemoryAllocator *s_00;
  int iVar2;
  char *pcVar3;
  size_t len;
  MIR_module_t_conflict module;
  MIR_module_t M;
  _func_LClosure_ptr_lua_State_ptr *load_in_lua;
  int rc;
  int opt_level;
  Ravi_CompilerInterface ravicomp_interface;
  C_MemoryAllocator allocator;
  CompilerContext ccontext;
  char *options_local;
  char *s_local;
  lua_State *L_local;
  
  prVar1 = L->l_G->ravi_state;
  allocator.destroy_arena = (_func_size_t_void_ptr *)L;
  ravicomp_interface.error_message = (_func_void_void_ptr_char_ptr *)create_mspace(0,0);
  allocator.arena = mspace_realloc;
  allocator.realloc = mspace_calloc;
  allocator.calloc = mspace_free;
  allocator.free = create_mspace;
  allocator.create_arena = destroy_mspace;
  _rc = &allocator.destroy_arena;
  ravicomp_interface.context = s;
  ravicomp_interface.source = (char *)strlen(s);
  ravicomp_interface.source_len = (long)"_IO_input" + 4;
  ravicomp_interface.source_name = (char *)0x0;
  memset(&ravicomp_interface.compiler_options,0,0x1f);
  ravicomp_interface._64_8_ = &ravicomp_interface.error_message;
  ravicomp_interface.memory_allocator = (C_MemoryAllocator *)0x0;
  ravicomp_interface.generated_code = (char *)debug_message;
  ravicomp_interface.debug_message = error_message;
  load_in_lua._4_4_ = raviV_getoptlevel(L);
  pcVar3 = strstr(options,"-O3");
  if (pcVar3 == (char *)0x0) {
    pcVar3 = strstr(options,"-O2");
    if (pcVar3 == (char *)0x0) {
      pcVar3 = strstr(options,"-O1");
      if (pcVar3 == (char *)0x0) {
        pcVar3 = strstr(options,"-O0");
        if (pcVar3 != (char *)0x0) {
          load_in_lua._4_4_ = 0;
        }
      }
      else {
        load_in_lua._4_4_ = 1;
      }
    }
    else {
      load_in_lua._4_4_ = 2;
    }
  }
  else {
    load_in_lua._4_4_ = 3;
  }
  prVar1->id = prVar1->id + 1;
  snprintf((char *)&ravicomp_interface.compiler_options,0x1f,"__luachunk_%lld");
  ravicomp_interface.source_name = options;
  iVar2 = raviX_compile(&rc);
  if ((ravicomp_interface.memory_allocator != (C_MemoryAllocator *)0x0) &&
     (pcVar3 = strstr(options,"--verbose"), s_00 = ravicomp_interface.memory_allocator,
     pcVar3 != (char *)0x0)) {
    len = strlen((char *)ravicomp_interface.memory_allocator);
    ravi_writestring(L,(char *)s_00,len);
  }
  if (iVar2 == 0) {
    M = (MIR_module_t)0x0;
    mir_prepare(prVar1->jit,load_in_lua._4_4_);
    module = mir_compile_C_module
                       (&prVar1->options,prVar1->jit,(char *)ravicomp_interface.memory_allocator,
                        "input");
    if (module != (MIR_module_t_conflict)0x0) {
      M = (MIR_module_t)
          mir_get_func(prVar1->jit,module,(char *)&ravicomp_interface.compiler_options);
    }
    mir_cleanup(prVar1->jit);
    if (M == (MIR_module_t)0x0) {
      load_in_lua._0_4_ = -1;
    }
    else {
      setup_lua_closure(L,(_func_LClosure_ptr_lua_State_ptr *)M);
      load_in_lua._0_4_ = 0;
    }
    raviX_release(&rc);
    destroy_mspace(ravicomp_interface.error_message);
    L_local._4_4_ = (uint)((int)load_in_lua == 0);
  }
  else {
    destroy_mspace(ravicomp_interface.error_message);
    L_local._4_4_ = 0;
  }
  return L_local._4_4_;
}

Assistant:

static int load_and_compile_internal(lua_State* L, const char* s, const char* options) {
  struct CompilerContext ccontext = {.L = L, .jit = G(L)->ravi_state};
  C_MemoryAllocator allocator = {.arena = create_mspace(0, 0),
                                 .create_arena = create_mspace,
                                 .destroy_arena = destroy_mspace,
                                 .calloc = mspace_calloc,
                                 .realloc = mspace_realloc,
                                 .free = mspace_free};
  Ravi_CompilerInterface ravicomp_interface = {.source = s,
                                               .source_len = strlen(s),
                                               .source_name = "input",
                                               .generated_code = NULL,
                                               .context = &ccontext,
                                               .memory_allocator = &allocator,
                                               .debug_message = debug_message,
                                               .error_message = error_message};
  int opt_level = raviV_getoptlevel(L); // Get default opt level
  if (strstr(options, "-O3")) opt_level = 3;
  else if (strstr(options, "-O2")) opt_level = 2;
  else if (strstr(options, "-O1")) opt_level = 1;
  else if (strstr(options, "-O0")) opt_level = 0;
#ifdef USE_MIRJIT
  snprintf(ravicomp_interface.main_func_name, sizeof ravicomp_interface.main_func_name, "__luachunk_%lld",
           ccontext.jit->id++);
#else
  snprintf(ravicomp_interface.main_func_name, sizeof ravicomp_interface.main_func_name, "mymain");
#endif
  ravicomp_interface.compiler_options = options;
  /* Generate C code */
  int rc = raviX_compile(&ravicomp_interface);
  if (ravicomp_interface.generated_code && strstr(options, "--verbose") != NULL) {
    ravi_writestring(L, ravicomp_interface.generated_code, strlen(ravicomp_interface.generated_code));
  }
  if (rc == 0) {
#ifdef USE_MIRJIT
    /* Compile C code */
    LClosure* (*load_in_lua)(lua_State * L) = NULL;
    mir_prepare(ccontext.jit->jit, opt_level);
    MIR_module_t M =
        mir_compile_C_module(&ccontext.jit->options, ccontext.jit->jit, ravicomp_interface.generated_code, "input");
    if (M != NULL) {
      load_in_lua = mir_get_func(ccontext.jit->jit, M, ravicomp_interface.main_func_name);
    }
    mir_cleanup(ccontext.jit->jit);
    if (load_in_lua != NULL) {
      /* Execute compiled code */
      setup_lua_closure(L, load_in_lua);
    }
    else {
      rc = -1;
    }
    raviX_release(&ravicomp_interface);
    destroy_mspace(allocator.arena);
    // If successful the closure will be left on top of stack
    return rc == 0 ? 1 : 0;
#else
    raviX_release(&ravicomp_interface);
    destroy_mspace(allocator.arena);
    return 0;
#endif
  }
  else {
    destroy_mspace(allocator.arena);
    return 0;
  }
}